

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_meta_move(int c,Fl_Text_Editor *e)

{
  int iVar1;
  Fl_Text_Buffer *pFVar2;
  Fl_Text_Editor *e_local;
  int c_local;
  
  pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  iVar1 = Fl_Text_Buffer::selected(pFVar2);
  if (iVar1 == 0) {
    iVar1 = Fl_Text_Display::insert_position(&e->super_Fl_Text_Display);
    (e->super_Fl_Text_Display).dragPos = iVar1;
  }
  if ((c != 0xff52) && (c != 0xff54)) {
    pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
    Fl_Text_Buffer::unselect(pFVar2);
    Fl::copy((EVP_PKEY_CTX *)0x28311c,(EVP_PKEY_CTX *)0x0);
    Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  }
  switch(c) {
  case 0xff51:
    kf_move(0xff50,e);
    break;
  case 0xff52:
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,0);
    Fl_Text_Display::scroll(&e->super_Fl_Text_Display,0,0);
    break;
  case 0xff53:
    kf_move(0xff57,e);
    break;
  case 0xff54:
    pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
    iVar1 = Fl_Text_Buffer::length(pFVar2);
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,iVar1);
    pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
    iVar1 = Fl_Text_Buffer::length(pFVar2);
    iVar1 = Fl_Text_Display::count_lines(&e->super_Fl_Text_Display,0,iVar1,true);
    Fl_Text_Display::scroll(&e->super_Fl_Text_Display,iVar1,0);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_meta_move(int c, Fl_Text_Editor* e) {
  if (!e->buffer()->selected())
    e->dragPos = e->insert_position();
  if (c != FL_Up && c != FL_Down) {
    e->buffer()->unselect();
    Fl::copy("", 0, 0);
    e->show_insert_position();
  }
  switch (c) {
    case FL_Up:				// top of buffer
      e->insert_position(0);
      e->scroll(0, 0);
      break;
    case FL_Down:			// end of buffer
      e->insert_position(e->buffer()->length());
      e->scroll(e->count_lines(0, e->buffer()->length(), 1), 0);
      break;
    case FL_Left:			// beginning of line
      kf_move(FL_Home, e);
      break;
    case FL_Right:			// end of line
      kf_move(FL_End, e);
      break;
  }
  return 1;
}